

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_MoniteredItem_SampleCallback(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  UA_Subscription *pUVar9;
  UA_Session *pUVar10;
  UA_SecureChannel *pUVar11;
  MonitoredItem_queuedValue *pMVar12;
  MonitoredItem_queuedValue **ppMVar13;
  anon_struct_16_2_4dd83919_for_listEntry *paVar14;
  UA_Boolean UVar15;
  UA_StatusCode UVar16;
  uint uVar17;
  size_t length;
  MonitoredItem_queuedValue *__ptr;
  MonitoredItem_queuedValue *pMVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  char *msg;
  UA_DataValue *pUVar23;
  UA_DataValue *pUVar24;
  UA_Logger logger;
  ulong uVar25;
  byte bVar26;
  byte bVar27;
  UA_Byte aUStack_348 [504];
  undefined8 uStack_150;
  UA_ReadValueId local_148;
  UA_DataValue local_f8;
  undefined1 auStack_98 [8];
  UA_ByteString cbs;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 auStack_48 [8];
  UA_ByteString valueEncoding;
  
  bVar27 = 0;
  if (monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
    return;
  }
  pUVar9 = monitoredItem->subscription;
  local_148.dataEncoding.name.length = 0;
  local_148.dataEncoding.name.data = (UA_Byte *)0x0;
  local_148.dataEncoding.namespaceIndex = 0;
  local_148.dataEncoding._2_6_ = 0;
  local_148.nodeId.namespaceIndex = (monitoredItem->monitoredNodeId).namespaceIndex;
  local_148.nodeId._2_2_ = *(undefined2 *)&(monitoredItem->monitoredNodeId).field_0x2;
  local_148.nodeId.identifierType = (monitoredItem->monitoredNodeId).identifierType;
  local_148.nodeId.identifier.string.length =
       (monitoredItem->monitoredNodeId).identifier.string.length;
  local_148.nodeId.identifier.string.data = (monitoredItem->monitoredNodeId).identifier.string.data;
  local_148._28_4_ = 0;
  local_148.attributeId = monitoredItem->attributeID;
  local_148.indexRange.length = (monitoredItem->indexRange).length;
  local_148.indexRange.data = (monitoredItem->indexRange).data;
  local_f8.serverTimestamp = 0;
  local_f8.serverPicoseconds = 0;
  local_f8._90_6_ = 0;
  local_f8.sourceTimestamp = 0;
  local_f8.sourcePicoseconds = 0;
  local_f8._74_6_ = 0;
  local_f8.value.arrayDimensions = (UA_UInt32 *)0x0;
  local_f8.status = 0;
  local_f8._60_4_ = 0;
  local_f8.value.data = (void *)0x0;
  local_f8.value.arrayDimensionsSize = 0;
  local_f8.value.storageType = UA_VARIANT_DATA;
  local_f8.value._12_4_ = 0;
  local_f8.value.arrayLength = 0;
  local_f8._0_8_ = 0;
  local_f8.value.type = (UA_DataType *)0x0;
  uStack_150 = 0x12092e;
  Service_Read_single(server,(UA_Session *)monitoredItem,monitoredItem->timestampsToReturn,
                      &local_148,&local_f8);
  cbs.data = aUStack_348;
  auStack_48 = (undefined1  [8])0x200;
  bVar19 = local_f8._0_1_;
  bVar26 = bVar19 & 0xfe;
  if (monitoredItem->trigger != UA_DATACHANGETRIGGER_STATUS) {
    bVar26 = bVar19;
  }
  bVar20 = 0xd7;
  if (monitoredItem->trigger < UA_DATACHANGETRIGGER_STATUSVALUETIMESTAMP) {
    bVar20 = 0xc3;
  }
  local_f8._0_1_ = bVar20 & bVar26;
  valueEncoding.length = (size_t)cbs.data;
  length = UA_calcSizeBinary(&local_f8,UA_TYPES + 0x16);
  if ((length == 0) ||
     ((0x200 < length &&
      (UVar16 = UA_ByteString_allocBuffer((UA_ByteString *)auStack_48,length), UVar16 != 0)))) {
    bVar1 = 0;
    bVar20 = 0;
  }
  else {
    auStack_98 = (undefined1  [8])0x0;
    bVar1 = 0;
    UVar16 = UA_encodeBinary(&local_f8,UA_TYPES + 0x16,(UA_exchangeEncodeBuffer)0x0,(void *)0x0,
                             (UA_ByteString *)auStack_48,(size_t *)auStack_98);
    bVar20 = 0;
    if (UVar16 == 0) {
      auStack_48 = auStack_98;
      if (((monitoredItem->lastSampledValue).data == (UA_Byte *)0x0) ||
         (UVar15 = UA_String_equal((UA_String *)auStack_48,&monitoredItem->lastSampledValue),
         !UVar15)) {
        bVar1 = 1;
        bVar20 = 1;
      }
      else {
        bVar20 = 1;
        bVar1 = 0;
      }
    }
  }
  bVar26 = bVar26 & 0x3c | bVar19 & 1 | local_f8._0_1_ & 0xc2;
  local_f8._0_1_ = bVar26;
  if (!(bool)(bVar1 & bVar20)) goto LAB_00120e0c;
  __ptr = (MonitoredItem_queuedValue *)malloc(0x78);
  if (__ptr == (MonitoredItem_queuedValue *)0x0) {
    pUVar10 = pUVar9->session;
    pUVar11 = pUVar10->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be allocated"
                   ,uVar21,uVar25,(ulong)(pUVar10->sessionId).identifier.numeric,
                   (ulong)(pUVar10->sessionId).identifier.guid.data2,
                   (ulong)(pUVar10->sessionId).identifier.guid.data3,
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[0],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[1],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[2],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[3],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[4],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[5],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[6],
                   (ulong)(pUVar10->sessionId).identifier.guid.data4[7],
                   (ulong)pUVar9->subscriptionID,(ulong)monitoredItem->itemId);
    goto LAB_00120e0c;
  }
  if ((UA_Byte *)valueEncoding.length == cbs.data) {
    UVar16 = UA_ByteString_copy((UA_ByteString *)auStack_48,(UA_ByteString *)auStack_98);
    if (UVar16 == 0) {
      auStack_48 = auStack_98;
      valueEncoding.length = cbs.length;
      bVar26 = local_f8._0_1_;
      goto LAB_00120a5b;
    }
    logger = (server->config).logger;
    pUVar10 = pUVar9->session;
    pUVar11 = pUVar10->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    uVar17 = (pUVar10->sessionId).identifier.numeric;
    uVar5 = (pUVar10->sessionId).identifier.guid.data2;
    uVar6 = (pUVar10->sessionId).identifier.guid.data3;
    bVar27 = (pUVar10->sessionId).identifier.guid.data4[0];
    bVar26 = (pUVar10->sessionId).identifier.guid.data4[1];
    bVar19 = (pUVar10->sessionId).identifier.guid.data4[2];
    bVar20 = (pUVar10->sessionId).identifier.guid.data4[3];
    bVar1 = (pUVar10->sessionId).identifier.guid.data4[4];
    bVar2 = (pUVar10->sessionId).identifier.guid.data4[5];
    bVar3 = (pUVar10->sessionId).identifier.guid.data4[6];
    bVar4 = (pUVar10->sessionId).identifier.guid.data4[7];
    uVar7 = pUVar9->subscriptionID;
    uVar8 = monitoredItem->itemId;
    msg = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | ByteString to compare values could not be created"
    ;
  }
  else {
LAB_00120a5b:
    if (((bVar26 & 1) == 0) || (local_f8.value.storageType != UA_VARIANT_DATA_NODELETE)) {
      pUVar23 = &local_f8;
      pUVar24 = &__ptr->value;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(undefined8 *)pUVar24 = *(undefined8 *)pUVar23;
        pUVar23 = (UA_DataValue *)((long)pUVar23 + ((ulong)bVar27 * -2 + 1) * 8);
        pUVar24 = (UA_DataValue *)((long)pUVar24 + (ulong)bVar27 * -0x10 + 8);
      }
LAB_00120b07:
      __ptr->clientHandle = monitoredItem->clientHandle;
      UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
      (monitoredItem->lastSampledValue).length = (size_t)auStack_48;
      (monitoredItem->lastSampledValue).data = (UA_Byte *)valueEncoding.length;
      uVar17 = monitoredItem->currentQueueSize;
      if (monitoredItem->maxQueueSize <= uVar17) {
        if (monitoredItem->discardOldest == true) {
          pMVar18 = (MonitoredItem_queuedValue *)&monitoredItem->queue;
        }
        else {
          pMVar18 = (monitoredItem->queue).tqh_last[1];
        }
        pMVar18 = (pMVar18->listEntry).tqe_next;
        if (pMVar18 == (MonitoredItem_queuedValue *)0x0) {
          __assert_fail("queueItem",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                        ,0x5cc2,"void ensureSpaceInMonitoredItemQueue(UA_MonitoredItem *)");
        }
        pMVar12 = (pMVar18->listEntry).tqe_next;
        paVar14 = &pMVar12->listEntry;
        if (pMVar12 == (MonitoredItem_queuedValue *)0x0) {
          paVar14 = (anon_struct_16_2_4dd83919_for_listEntry *)&monitoredItem->queue;
        }
        ppMVar13 = (pMVar18->listEntry).tqe_prev;
        paVar14->tqe_prev = ppMVar13;
        *ppMVar13 = pMVar12;
        UA_DataValue_deleteMembers(&pMVar18->value);
        free(pMVar18);
        uVar17 = monitoredItem->currentQueueSize - 1;
      }
      (__ptr->listEntry).tqe_next = (MonitoredItem_queuedValue *)0x0;
      ppMVar13 = (monitoredItem->queue).tqh_last;
      (__ptr->listEntry).tqe_prev = ppMVar13;
      *ppMVar13 = __ptr;
      (monitoredItem->queue).tqh_last = (MonitoredItem_queuedValue **)__ptr;
      monitoredItem->currentQueueSize = uVar17 + 1;
      return;
    }
    UVar16 = UA_DataValue_copy(&local_f8,&__ptr->value);
    if (UVar16 == 0) goto LAB_00120b07;
    logger = (server->config).logger;
    pUVar10 = pUVar9->session;
    pUVar11 = pUVar10->channel;
    if (pUVar11 == (UA_SecureChannel *)0x0) {
      uVar21 = 0;
      uVar25 = 0;
    }
    else {
      if (pUVar11->connection == (UA_Connection *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      uVar25 = (ulong)(pUVar11->securityToken).channelId;
    }
    uVar17 = (pUVar10->sessionId).identifier.numeric;
    uVar5 = (pUVar10->sessionId).identifier.guid.data2;
    uVar6 = (pUVar10->sessionId).identifier.guid.data3;
    bVar27 = (pUVar10->sessionId).identifier.guid.data4[0];
    bVar26 = (pUVar10->sessionId).identifier.guid.data4[1];
    bVar19 = (pUVar10->sessionId).identifier.guid.data4[2];
    bVar20 = (pUVar10->sessionId).identifier.guid.data4[3];
    bVar1 = (pUVar10->sessionId).identifier.guid.data4[4];
    bVar2 = (pUVar10->sessionId).identifier.guid.data4[5];
    bVar3 = (pUVar10->sessionId).identifier.guid.data4[6];
    bVar4 = (pUVar10->sessionId).identifier.guid.data4[7];
    uVar7 = pUVar9->subscriptionID;
    uVar8 = monitoredItem->itemId;
    msg = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be prepared"
    ;
  }
  local_50 = (ulong)bVar19;
  local_58 = (ulong)bVar26;
  local_60 = (ulong)bVar27;
  local_68 = (ulong)uVar6;
  local_70 = (ulong)uVar5;
  local_78 = (ulong)bVar20;
  UA_LOG_WARNING(logger,UA_LOGCATEGORY_SESSION,msg,uVar21,uVar25,(ulong)uVar17,local_70,local_68,
                 local_60,local_58,local_50,local_78,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,
                 (ulong)bVar4,(ulong)uVar7,(ulong)uVar8);
  free(__ptr);
LAB_00120e0c:
  if ((UA_Byte *)valueEncoding.length != cbs.data) {
    UA_ByteString_deleteMembers((UA_ByteString *)auStack_48);
  }
  UA_DataValue_deleteMembers(&local_f8);
  return;
}

Assistant:

void UA_MoniteredItem_SampleCallback(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    UA_Subscription *sub = monitoredItem->subscription;
    if(monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | MonitoredItem %i | "
                             "Not a data change notification",
                             sub->subscriptionID, monitoredItem->itemId);
        return;
    }

    /* Read the value */
    UA_ReadValueId rvid;
    UA_ReadValueId_init(&rvid);
    rvid.nodeId = monitoredItem->monitoredNodeId;
    rvid.attributeId = monitoredItem->attributeID;
    rvid.indexRange = monitoredItem->indexRange;
    UA_DataValue value;
    UA_DataValue_init(&value);
    Service_Read_single(server, sub->session, monitoredItem->timestampsToReturn,
                        &rvid, &value);

    /* Stack-allocate some memory for the value encoding */
    UA_Byte *stackValueEncoding = UA_alloca(UA_VALUENCODING_MAXSTACK);
    UA_ByteString valueEncoding;
    valueEncoding.data = stackValueEncoding;
    valueEncoding.length = UA_VALUENCODING_MAXSTACK;

    /* Has the value changed? */
    UA_Boolean changed = false;
    UA_StatusCode retval = detectValueChange(monitoredItem, &value,
                                             &valueEncoding, &changed);
    if(!changed || retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    /* Allocate the entry for the publish queue */
    MonitoredItem_queuedValue *newQueueItem = UA_malloc(sizeof(MonitoredItem_queuedValue));
    if(!newQueueItem) {
        UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                               "Subscription %u | MonitoredItem %i | "
                               "Item for the publishing queue could not be allocated",
                               sub->subscriptionID, monitoredItem->itemId);
        goto cleanup;
    }

    /* Copy valueEncoding on the heap for the next comparison (if not already done) */
    if(valueEncoding.data == stackValueEncoding) {
        UA_ByteString cbs;
        if(UA_ByteString_copy(&valueEncoding, &cbs) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "ByteString to compare values could not be created",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
        valueEncoding = cbs;
    }

    /* Prepare the newQueueItem */
    if(value.hasValue && value.value.storageType == UA_VARIANT_DATA_NODELETE) {
        if(UA_DataValue_copy(&value, &newQueueItem->value) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "Item for the publishing queue could not be prepared",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
    } else {
        newQueueItem->value = value;
    }
    newQueueItem->clientHandle = monitoredItem->clientHandle;

    /* <-- Point of no return --> */

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | MonitoredItem %u | Sampled a new value",
                         sub->subscriptionID, monitoredItem->itemId);

    /* Replace the encoding for comparison */
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    monitoredItem->lastSampledValue = valueEncoding;

    /* Add the sample to the queue for publication */
    ensureSpaceInMonitoredItemQueue(monitoredItem);
    TAILQ_INSERT_TAIL(&monitoredItem->queue, newQueueItem, listEntry);
    ++monitoredItem->currentQueueSize;
    return;

 cleanup:
    if(valueEncoding.data != stackValueEncoding)
        UA_ByteString_deleteMembers(&valueEncoding);
    UA_DataValue_deleteMembers(&value);
}